

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Skeleton_blocker_simplex.h
# Opt level: O0

bool __thiscall
Gudhi::skeleton_blocker::
Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>::
contains_difference(Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
                    *this,Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
                          *a,Vertex_handle x,Vertex_handle y)

{
  bool bVar1;
  reference pVVar2;
  reference pVVar3;
  _Self local_48;
  const_iterator last2;
  const_iterator first2;
  const_iterator last1;
  const_iterator first1;
  Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
  *a_local;
  Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
  *this_local;
  Vertex_handle local_10;
  Vertex_handle y_local;
  Vertex_handle x_local;
  
  this_local._4_4_ = y.vertex;
  local_10.vertex = x.vertex;
  last1 = begin(this);
  first2 = end(this);
  last2 = begin(a);
  local_48._M_node = (_Base_ptr)end(a);
  do {
    while( true ) {
      bVar1 = std::operator!=(&last2,&local_48);
      if (!bVar1) {
        return true;
      }
      pVVar2 = std::
               _Rb_tree_const_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
               ::operator*(&last2);
      bVar1 = Skeleton_blocker_simple_traits::Vertex_handle::operator==(&local_10,pVVar2);
      if (!bVar1) break;
LAB_0013efc8:
      std::
      _Rb_tree_const_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
      ::operator++(&last2);
    }
    pVVar2 = std::
             _Rb_tree_const_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
             ::operator*(&last2);
    bVar1 = Skeleton_blocker_simple_traits::Vertex_handle::operator==
                      ((Vertex_handle *)((long)&this_local + 4),pVVar2);
    if (bVar1) goto LAB_0013efc8;
    bVar1 = std::operator==(&last1,&first2);
    if (bVar1) {
      return false;
    }
    pVVar2 = std::
             _Rb_tree_const_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
             ::operator*(&last2);
    pVVar3 = std::
             _Rb_tree_const_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
             ::operator*(&last1);
    bVar1 = Skeleton_blocker_simple_traits::Vertex_handle::operator<(pVVar2,pVVar3);
    if (bVar1) {
      return false;
    }
    pVVar2 = std::
             _Rb_tree_const_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
             ::operator*(&last1);
    pVVar3 = std::
             _Rb_tree_const_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
             ::operator*(&last2);
    bVar1 = Skeleton_blocker_simple_traits::Vertex_handle::operator<(pVVar2,pVVar3);
    if (!bVar1) {
      std::
      _Rb_tree_const_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
      ::operator++(&last2);
    }
    std::
    _Rb_tree_const_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
    ::operator++(&last1);
  } while( true );
}

Assistant:

bool contains_difference(const Skeleton_blocker_simplex& a, T x, T y) const {
    auto first1 = begin();
    auto last1 = end();

    auto first2 = a.begin();
    auto last2 = a.end();

    while (first2 != last2) {
      // we ignore vertices of x,y
      if (x == *first2 || y == *first2) {
        ++first2;
      } else {
        if ((first1 == last1) || (*first2 < *first1))
          return false;
        if (!(*first1 < *first2))
          ++first2;
        ++first1;
      }
    }
    return true;
  }